

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O2

void my_numbox_draw_config(t_my_numbox *x,_glist *glist)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  t_iem_fstyle_flags tVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  _glist *p_Var8;
  undefined4 extraout_var;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  t_atom fontatoms [3];
  char tag [128];
  undefined8 uVar9;
  
  p_Var8 = (x->x_gui).x_glist;
  uVar1 = p_Var8->gl_zoom;
  p_Var8 = glist_getcanvas(p_Var8);
  uVar5 = text_xpix((t_text *)x,glist);
  uVar13 = (ulong)uVar5;
  iVar6 = text_ypix((t_text *)x,glist);
  uVar9 = CONCAT44(extraout_var,iVar6);
  iVar2 = (x->x_gui).x_h;
  uVar7 = (x->x_gui).x_w + uVar5;
  uVar12 = (x->x_gui).x_fcol;
  uVar3 = (x->x_gui).x_lcol;
  fontatoms[0].a_type = A_SYMBOL;
  fontatoms[0].a_w.w_symbol = gensym((x->x_gui).x_font);
  fontatoms[1].a_type = A_FLOAT;
  fontatoms[1].a_w._0_4_ = (undefined4)(int)-((x->x_gui).x_fontsize * uVar1);
  fontatoms[2].a_type = A_SYMBOL;
  fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
  tVar4 = (x->x_gui).x_fsf;
  bVar14 = ((uint)tVar4 >> 0x18 & 1) != 0;
  if (bVar14) {
    uVar3 = 0xff;
  }
  if (bVar14) {
    uVar12 = 0xff;
  }
  uVar10 = 0xff0000;
  if (((uint)tVar4 >> 0x1b & 1) == 0) {
    uVar10 = (ulong)uVar12;
  }
  my_numbox_ftoa(x);
  sprintf(tag,"%lxBASE1",x);
  uVar11 = (ulong)(uint)((x->x_gui).x_h + iVar6);
  pdgui_vmess((char *)0x0,"crs  ii ii ii ii ii ii",p_Var8,"coords",tag,uVar13,uVar9,
              (ulong)(uVar7 - iVar2 / 4),uVar9,(ulong)uVar7,(ulong)(uint)(iVar2 / 4 + iVar6),
              (ulong)uVar7,uVar11,uVar13,uVar11,uVar13,uVar9);
  pdgui_vmess((char *)0x0,"crs  ri rk rk",p_Var8,"itemconfigure",tag,"-width",(ulong)uVar1,
              "-outline",0,"-fill",(ulong)(uint)(x->x_gui).x_bcol);
  sprintf(tag,"%lxBASE2",x);
  uVar7 = iVar2 / 2 + uVar5;
  uVar12 = iVar2 / 2 + iVar6;
  pdgui_vmess((char *)0x0,"crs  ii ii ii",p_Var8,"coords",tag,(ulong)(uVar5 + uVar1),
              (ulong)(uVar1 + iVar6),(ulong)uVar7,(ulong)uVar12,(ulong)(uVar5 + uVar1),
              (ulong)((iVar6 - uVar1) + (x->x_gui).x_h));
  pdgui_vmess((char *)0x0,"crs  ri rk",p_Var8,"itemconfigure",tag,"-width",(ulong)uVar1,"-fill",
              (ulong)(uint)(x->x_gui).x_fcol);
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs  ii",p_Var8,"coords",tag,(ulong)((x->x_gui).x_ldx * uVar1 + uVar5),
              (ulong)((x->x_gui).x_ldy * uVar1 + iVar6));
  pdgui_vmess((char *)0x0,"crs  rA rk",p_Var8,"itemconfigure",tag,"-font",3,fontatoms,"-fill",
              (ulong)uVar3);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  sprintf(tag,"%lxNUMBER",x);
  pdgui_vmess((char *)0x0,"crs  ii",p_Var8,"coords",tag,(ulong)(uVar7 + uVar1 * 2),
              (ulong)(uVar12 + uVar1 + iVar2 / (int)(uVar1 * 0x22)));
  pdgui_vmess((char *)0x0,"crs  rs rA rk",p_Var8,"itemconfigure",tag,"-text",x->x_buf,"-font",3,
              fontatoms,"-fill",uVar10);
  return;
}

Assistant:

static void my_numbox_draw_config(t_my_numbox* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_canvas *canvas = glist_getcanvas(glist);
    t_iemgui *iemgui = &x->x_gui;
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int w = x->x_gui.x_w, half = x->x_gui.x_h/2;
    int d = zoom + x->x_gui.x_h/(34*zoom);
    int corner = x->x_gui.x_h/4;
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    char tag[128];

    int lcol = x->x_gui.x_lcol;
    int fcol = x->x_gui.x_fcol;
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    if(x->x_gui.x_fsf.x_selected)
        fcol = lcol = IEM_GUI_COLOR_SELECTED;
    if(x->x_gui.x_fsf.x_change)
        fcol =  IEM_GUI_COLOR_EDITED;

    my_numbox_ftoa(x);

    sprintf(tag, "%lxBASE1", x);
    pdgui_vmess(0, "crs  ii ii ii ii ii ii", canvas, "coords", tag,
        xpos,              ypos,
        xpos + w - corner, ypos,
        xpos + w,          ypos + corner,
        xpos + w,          ypos + x->x_gui.x_h,
        xpos,              ypos + x->x_gui.x_h,
        xpos,              ypos);
    pdgui_vmess(0, "crs  ri rk rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-outline", IEM_GUI_COLOR_NORMAL,
        "-fill", x->x_gui.x_bcol);


    sprintf(tag, "%lxBASE2", x);
    pdgui_vmess(0, "crs  ii ii ii", canvas, "coords", tag,
        xpos + zoom, ypos + zoom,
        xpos + half, ypos + half,
        xpos + zoom, ypos + x->x_gui.x_h - zoom);
    pdgui_vmess(0, "crs  ri rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-fill", x->x_gui.x_fcol);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs  ii", canvas, "coords", tag,
        xpos + x->x_gui.x_ldx * zoom,
        ypos + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs  rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);

    sprintf(tag, "%lxNUMBER", x);
    pdgui_vmess(0, "crs  ii", canvas, "coords", tag,
        xpos + half + 2*zoom, ypos + half + d);
    pdgui_vmess(0, "crs  rs rA rk", canvas, "itemconfigure", tag,
        "-text", x->x_buf,
        "-font", 3, fontatoms,
        "-fill", fcol);
}